

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::ComputeFileMD5(string *source,char *md5out)

{
  cmCryptoHashMD5 *this;
  byte bVar1;
  char *__src;
  undefined1 local_48 [8];
  string str;
  cmCryptoHashMD5 md5;
  char *md5out_local;
  string *source_local;
  
  this = (cmCryptoHashMD5 *)((long)&str.field_2 + 8);
  cmCryptoHashMD5::cmCryptoHashMD5(this);
  cmCryptoHash::HashFile((string *)local_48,(cmCryptoHash *)this,source);
  __src = (char *)std::__cxx11::string::c_str();
  strncpy(md5out,__src,0x20);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_48);
  cmCryptoHashMD5::~cmCryptoHashMD5((cmCryptoHashMD5 *)((long)&str.field_2 + 8));
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool cmSystemTools::ComputeFileMD5(const std::string& source, char* md5out)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHashMD5 md5;
  std::string str = md5.HashFile(source);
  strncpy(md5out, str.c_str(), 32);
  return !str.empty();
#else
  (void)source;
  (void)md5out;
  cmSystemTools::Message("md5sum not supported in bootstrapping mode","Error");
  return false;
#endif
}